

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

WithinUlpsMatcher * Catch::Matchers::WithinULP(double target,uint64_t maxUlpDiff)

{
  WithinUlpsMatcher *in_RDI;
  
  (in_RDI->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(in_RDI->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.
                 field_2;
  (in_RDI->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0
  ;
  (in_RDI->super_MatcherBase<double>).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf
  [0] = '\0';
  (in_RDI->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_001970c0;
  (in_RDI->super_MatcherBase<double>).super_MatcherMethod<double>._vptr_MatcherMethod =
       (_func_int **)&DAT_001970f0;
  in_RDI->m_target = target;
  in_RDI->m_ulps = maxUlpDiff;
  in_RDI->m_type = Double;
  return in_RDI;
}

Assistant:

Floating::WithinUlpsMatcher WithinULP(double target, uint64_t maxUlpDiff) {
    return Floating::WithinUlpsMatcher(target, maxUlpDiff, Floating::FloatingPointKind::Double);
}